

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

void insch(Terminal *term,wchar_t n)

{
  wchar_t wVar1;
  wchar_t x;
  bool bVar2;
  wchar_t wVar3;
  termline *line;
  wchar_t wVar4;
  wchar_t y;
  termchar *ptVar5;
  long lVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  int iVar11;
  wchar_t wVar12;
  long lVar13;
  long lVar14;
  wchar_t wVar15;
  
  wVar10 = -n;
  wVar15 = n;
  if (n < L'\x01') {
    wVar15 = wVar10;
  }
  wVar1 = term->cols;
  x = (term->curs).x;
  wVar12 = wVar1 - x;
  if (wVar12 <= wVar15) {
    wVar15 = wVar12;
  }
  wVar3 = (term->selend).x;
  y = (term->curs).y;
  wVar4 = (term->selend).y;
  bVar2 = (term->curs).x < wVar3;
  if (y != wVar4) {
    bVar2 = y < wVar4;
  }
  if (bVar2) {
    wVar7 = (term->selstart).x;
    wVar8 = (term->selstart).y;
    bVar2 = wVar7 < wVar1;
    if (y != wVar8) {
      bVar2 = wVar8 < y;
    }
    if (bVar2) {
      wVar9 = wVar15 + x;
      if (L'\xffffffff' < n) {
        wVar9 = x;
      }
      bVar2 = y < wVar8;
      if (y == wVar8) {
        bVar2 = wVar9 <= wVar7;
      }
      if (bVar2) {
        wVar8 = L'\0';
        if (L'\xffffffff' < n) {
          wVar8 = wVar15;
        }
        bVar2 = wVar4 < y;
        if (y == wVar4) {
          bVar2 = wVar3 <= wVar1 - wVar8;
        }
        if (bVar2) {
          wVar4 = -wVar15;
          if (L'\xffffffff' < n) {
            wVar4 = wVar15;
          }
          wVar7 = wVar7 + wVar4;
          (term->selstart).x = wVar7;
          wVar4 = wVar4 + wVar3;
          (term->selend).x = wVar4;
          if (wVar7 < x) {
            __assert_fail("term->selstart.x >= term->curs.x",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                          ,0xb7d,"void insch(Terminal *, int)");
          }
          if (wVar1 <= wVar7) {
            __assert_fail("term->selstart.x < term->cols",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                          ,0xb7e,"void insch(Terminal *, int)");
          }
          if (wVar4 <= x) {
            __assert_fail("term->selend.x > term->curs.x",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                          ,0xb7f,"void insch(Terminal *, int)");
          }
          if (wVar1 < wVar4) {
            __assert_fail("term->selend.x <= term->cols",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                          ,0xb80,"void insch(Terminal *, int)");
          }
          goto LAB_00111c95;
        }
      }
      term->selstate = LEXICOGRAPHIC;
      (term->selstart).y = L'\0';
      (term->selstart).x = L'\0';
      (term->selend).y = L'\0';
      (term->selend).x = L'\0';
    }
  }
LAB_00111c95:
  check_boundary(term,x,y);
  if (n < L'\0') {
    check_boundary(term,wVar15 + (term->curs).x,(term->curs).y);
  }
  line = lineptr(term,(term->curs).y,L'஋',L'\x01');
  check_trust_status(term,line);
  if (n < L'\0') {
    lVar13 = (long)wVar10;
    if ((long)wVar10 < (long)n) {
      lVar13 = (long)n;
    }
    if (wVar12 <= lVar13) {
      lVar13 = (long)wVar12;
    }
    lVar6 = 0;
    for (lVar14 = 0; lVar14 < wVar1 - (wVar15 + x); lVar14 = lVar14 + 1) {
      ptVar5 = (termchar *)((long)&line->chars[(term->curs).x].chr + lVar6);
      move_termchar(line,ptVar5,ptVar5 + lVar13);
      lVar6 = lVar6 + 0x20;
    }
    if (n != wVar10 && SBORROW4(n,wVar10) == n * 2 < 0) {
      wVar10 = n;
    }
    if (wVar12 <= wVar10) {
      wVar10 = wVar12;
    }
    for (iVar11 = -wVar10; iVar11 != 0; iVar11 = iVar11 + 1) {
      copy_termchar(line,iVar11 + wVar12 + (term->curs).x,&term->erase_char);
    }
  }
  else {
    wVar15 = wVar12;
    if (n < wVar12) {
      wVar15 = n;
    }
    lVar14 = (long)(wVar1 - (x + wVar15));
    lVar6 = -lVar14;
    lVar14 = lVar14 << 5;
    lVar13 = (long)wVar10;
    if ((long)wVar10 < (long)n) {
      lVar13 = (long)n;
    }
    if (wVar12 <= lVar13) {
      lVar13 = (long)wVar12;
    }
    for (; lVar6 != 0; lVar6 = lVar6 + 1) {
      ptVar5 = (termchar *)((long)&line->chars[(long)(term->curs).x + -1].chr + lVar14);
      move_termchar(line,ptVar5 + lVar13,ptVar5);
      lVar14 = lVar14 + -0x20;
    }
    if (n != wVar10 && SBORROW4(n,wVar10) == n * 2 < 0) {
      wVar10 = n;
    }
    if (wVar12 <= wVar10) {
      wVar10 = wVar12;
    }
    while (wVar10 = wVar10 + L'\xffffffff', wVar10 != L'\xffffffff') {
      copy_termchar(line,(term->curs).x + wVar10,&term->erase_char);
    }
  }
  return;
}

Assistant:

static void insch(Terminal *term, int n)
{
    int dir = (n < 0 ? -1 : +1);
    int m, j;
    pos eol;
    termline *ldata;

    n = (n < 0 ? -n : n);
    if (n > term->cols - term->curs.x)
        n = term->cols - term->curs.x;
    m = term->cols - term->curs.x - n;

    /*
     * We must de-highlight the selection if it overlaps any part of
     * the region affected by this operation, i.e. the region from the
     * current cursor position to end-of-line, _unless_ the entirety
     * of the selection is going to be moved to the left or right by
     * this operation but otherwise unchanged, in which case we can
     * simply move the highlight with the text.
     */
    eol.y = term->curs.y;
    eol.x = term->cols;
    if (poslt(term->curs, term->selend) && poslt(term->selstart, eol)) {
        pos okstart = term->curs;
        pos okend = eol;
        if (dir > 0) {
            /* Insertion: n characters at EOL will be splatted. */
            okend.x -= n;
        } else {
            /* Deletion: n characters at cursor position will be splatted. */
            okstart.x += n;
        }
        if (posle(okstart, term->selstart) && posle(term->selend, okend)) {
            /* Selection is contained entirely in the interval
             * [okstart,okend), so we need only adjust the selection
             * bounds. */
            term->selstart.x += dir * n;
            term->selend.x += dir * n;
            assert(term->selstart.x >= term->curs.x);
            assert(term->selstart.x < term->cols);
            assert(term->selend.x > term->curs.x);
            assert(term->selend.x <= term->cols);
        } else {
            /* Selection is not wholly contained in that interval, so
             * we must unhighlight it. */
            deselect(term);
        }
    }

    check_boundary(term, term->curs.x, term->curs.y);
    if (dir < 0)
        check_boundary(term, term->curs.x + n, term->curs.y);
    ldata = scrlineptr(term->curs.y);
    check_trust_status(term, ldata);
    if (dir < 0) {
        for (j = 0; j < m; j++)
            move_termchar(ldata,
                          ldata->chars + term->curs.x + j,
                          ldata->chars + term->curs.x + j + n);
        while (n--)
            copy_termchar(ldata, term->curs.x + m++, &term->erase_char);
    } else {
        for (j = m; j-- ;)
            move_termchar(ldata,
                          ldata->chars + term->curs.x + j + n,
                          ldata->chars + term->curs.x + j);
        while (n--)
            copy_termchar(ldata, term->curs.x + n, &term->erase_char);
    }
}